

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O1

int Abc_NtkDontCareSimulateBefore(Odc_Man_t *p,uint *puTruth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  iVar1 = p->nBits;
  iVar2 = p->nWords;
  iVar6 = 0;
  iVar5 = 0;
  do {
    Abc_NtkDontCareSimulateSetRand(p);
    Abc_NtkDontCareSimulate(p,puTruth);
    iVar3 = 0;
    if (0 < (long)p->nWords) {
      lVar4 = 0;
      iVar3 = 0;
      do {
        iVar3 = (iVar3 + 1) - (uint)(puTruth[lVar4] == 0);
        lVar4 = lVar4 + 1;
      } while (p->nWords != lVar4);
    }
    iVar6 = iVar6 + iVar3;
    bVar7 = iVar5 == 0;
    iVar5 = iVar5 + 1;
  } while (bVar7);
  return ((iVar1 / iVar2) * iVar6) / 2;
}

Assistant:

int Abc_NtkDontCareSimulateBefore( Odc_Man_t * p, unsigned * puTruth )
{
    int nIters = 2;
    int nRounds, Counter, r;
    // decide how many rounds to simulate
    nRounds = p->nBits / p->nWords;
    Counter = 0;
    for ( r = 0; r < nIters; r++ )
    {
        Abc_NtkDontCareSimulateSetRand( p );
        Abc_NtkDontCareSimulate( p, puTruth );
        Counter += Abc_NtkDontCareCountMintsWord( p, puTruth );
    }
    // normalize
    Counter = Counter * nRounds / nIters;
    return Counter;
}